

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_coroutine.hpp
# Opt level: O1

void __thiscall squall::Coroutine::resume<int>(Coroutine *this,int v)

{
  SQRESULT SVar1;
  SQInteger SVar2;
  squirrel_error *this_00;
  
  validate_vm(this);
  sq_pushinteger(this->vm_,(long)v);
  SVar1 = sq_wakeupvm(this->vm_,1,1,1,0);
  if (-1 < SVar1) {
    SVar2 = sq_getvmstate(this->vm_);
    this->suspended_ = SVar2 == 2;
    return;
  }
  this_00 = (squirrel_error *)__cxa_allocate_exception(0x10);
  squirrel_error::runtime_error(this_00,"wake up vm failed");
  __cxa_throw(this_00,&squirrel_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void resume(T v) {
        validate_vm();
        detail::push(vm_, v);
        if (!SQ_SUCCEEDED(sq_wakeupvm(vm_, SQTrue, SQTrue, SQTrue, SQFalse))) {
            throw squirrel_error("wake up vm failed");
        }
        check_suspended();
    }